

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conversion.cpp
# Opt level: O2

string * Conversion::binToHex(string *__return_storage_ptr__,string *bin)

{
  ulong uVar1;
  string local_70;
  string aux;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar1 = 0; uVar1 <= bin->_M_string_length - 4; uVar1 = uVar1 + 4) {
    std::__cxx11::string::string((string *)&aux,(string *)bin,uVar1,4);
    std::__cxx11::string::string((string *)&local_70,(string *)&aux);
    binToDec(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&aux);
  }
  return __return_storage_ptr__;
}

Assistant:

string Conversion::binToHex(string bin){
    string resp;
    for(int i = 0;i <= bin.length()-4;i+=4){
        string aux(bin,i,4);
        int sullivan = binToDec(aux);
        if(sullivan > 9){
            sullivan += 0x37;
        }else{
            sullivan += 0x30;
        }
        resp += sullivan;
    }
    return resp;
}